

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALenum check_al_error_events(void)

{
  ALenum *local_20;
  ALenum *errorlatch;
  ALenum alerr;
  
  if (current_context == (ContextWrapper *)0x0) {
    errorlatch._4_4_ = 0;
  }
  else {
    errorlatch._4_4_ = (*REAL_alGetError)();
    if (errorlatch._4_4_ != 0) {
      if (current_context == (ContextWrapper *)0x0) {
        local_20 = &null_context_errorlatch;
      }
      else {
        local_20 = &current_context->errorlatch;
      }
      IO_EVENTENUM(ALEE_ALERROR_TRIGGERED);
      IO_ENUM(errorlatch._4_4_);
      if (*local_20 == 0) {
        *local_20 = errorlatch._4_4_;
      }
    }
  }
  return errorlatch._4_4_;
}

Assistant:

static ALenum check_al_error_events(void)
{
    if (!current_context) return AL_NO_ERROR;  // !!! FIXME: OpenAL-Soft returns AL_INVALID_OPERATION if no context is current.
    const ALenum alerr = REAL_alGetError();
    if (alerr != AL_NO_ERROR) {
        ALenum *errorlatch = current_context ? &current_context->errorlatch : &null_context_errorlatch;
        IO_EVENTENUM(ALEE_ALERROR_TRIGGERED);
        IO_ENUM(alerr);
        if (*errorlatch == AL_NO_ERROR) {
            *errorlatch = alerr;
        }
    }
    return alerr;
}